

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtree.hpp
# Opt level: O2

node_type * __thiscall
perior::
rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
::split_leaf(node_type *__return_storage_ptr__,
            rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
            *this,size_t N,size_t vidx,indexable_type *entry)

{
  container_type *this_00;
  aabb_type *node;
  aabb_type *ptnr;
  boundary_type *rhs;
  size_t sVar1;
  stored_size_type sVar2;
  double dVar3;
  node_type *pnVar4;
  vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
  *this_01;
  reference prVar5;
  double *pdVar6;
  reference puVar7;
  reference ppVar8;
  size_type sVar9;
  reference ppVar10;
  reference prVar11;
  ulong n;
  ulong uVar12;
  cubic_periodic_boundary<perior::point<double,_2UL>_> *b;
  pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *ppVar13;
  array<unsigned_long,_2UL> aVar14;
  pair<unsigned_long,_bool> pVar15;
  const_iterator i;
  temporal_entry_container entries;
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
  local_1f8;
  reference local_1f0;
  rtree<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_perior::quadratic<6UL,_2UL>,_perior::cubic_periodic_boundary<perior::point<double,_2UL>_>,_perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::equal_to<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>_>
  *local_1e8;
  node_type *local_1e0;
  vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
  *local_1d8;
  pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> local_1d0;
  vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
  *local_1a8;
  reference local_1a0;
  point_type *local_198;
  undefined1 local_190 [24];
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
  local_178 [3];
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
  local_160;
  vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
  local_158;
  pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> local_150 [7];
  ulong local_38;
  
  b = (cubic_periodic_boundary<perior::point<double,_2UL>_> *)entry;
  prVar5 = boost::container::
           vector<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>,_std::allocator<perior::detail::rtree_node<perior::point<double,_2UL>,_2UL,_6UL>_>,_void>
           ::at(&this->tree_,N);
  sVar1 = prVar5->parent;
  __return_storage_ptr__->is_leaf = true;
  __return_storage_ptr__->parent = sVar1;
  local_38 = 0;
  (__return_storage_ptr__->box).radius.values_.elems[0] = 0.0;
  (__return_storage_ptr__->box).radius.values_.elems[1] = 0.0;
  (__return_storage_ptr__->box).center.values_.elems[0] = 0.0;
  (__return_storage_ptr__->box).center.values_.elems[1] = 0.0;
  local_1d0.second.center.values_.elems[0] = (entry->center).values_.elems[0];
  local_1d0.second.center.values_.elems[1] = (entry->center).values_.elems[1];
  local_1d0.second.radius.values_.elems[0] = (entry->radius).values_.elems[0];
  local_1d0.second.radius.values_.elems[1] = (entry->radius).values_.elems[1];
  local_1e0 = __return_storage_ptr__;
  local_1d0.first = vidx;
  local_1a0 = prVar5;
  boost::container::
  vector<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,7ul,0ul,true>,void>
  ::priv_push_back<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>>
            ((vector<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,7ul,0ul,true>,void>
              *)local_150,&local_1d0);
  local_1f8.m_ptr =
       (pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)&prVar5->entry;
  sVar2 = (prVar5->entry).
          super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
          .m_holder.m_size;
  local_1f0 = prVar5;
  local_1e8 = this;
  local_1d8 = (vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
               *)local_1f8.m_ptr;
  while (prVar11 = local_1a0, pnVar4 = local_1e0,
        local_1f8.m_ptr !=
        (pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)
        ((prVar5->box).center.values_.elems + (sVar2 - 7))) {
    pdVar6 = (double *)
             boost::container::vec_iterator<unsigned_long_*,_true>::operator*
                       ((vec_iterator<unsigned_long_*,_true> *)&local_1f8);
    puVar7 = boost::container::vec_iterator<unsigned_long_*,_true>::operator*
                       ((vec_iterator<unsigned_long_*,_true> *)&local_1f8);
    ppVar8 = boost::container::
             vector<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>,_std::allocator<std::pair<perior::rectangle<perior::point<double,_2UL>_>,_unsigned_long>_>,_void>
             ::at(&this->container_,*puVar7);
    local_1d0.first = (unsigned_long)*pdVar6;
    local_1d0.second.center.values_.elems[0] = (ppVar8->first).center.values_.elems[0];
    local_1d0.second.center.values_.elems[1] = (ppVar8->first).center.values_.elems[1];
    local_1d0.second.radius.values_.elems[0] = (ppVar8->first).radius.values_.elems[0];
    local_1d0.second.radius.values_.elems[1] = (ppVar8->first).radius.values_.elems[1];
    boost::container::
    vector<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,7ul,0ul,true>,void>
    ::priv_push_back<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>>
              ((vector<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>,7ul,0ul,true>,void>
                *)local_150,&local_1d0);
    boost::container::vec_iterator<unsigned_long_*,_true>::operator++
              ((vec_iterator<unsigned_long_*,_true> *)&local_1f8);
  }
  (local_1a0->entry).
  super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  (local_1e0->entry).
  super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
  .m_holder.m_size = 0;
  this_00 = &local_1e0->entry;
  local_160.m_ptr = local_150 + local_38;
  local_158.m_ptr = local_150;
  aVar14 = rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
           ::
           pick_seeds<boost::container::vec_iterator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>*,false>>
                     ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                       *)local_1e8,&local_158,&local_160);
  n = aVar14.elems[1];
  sVar9 = aVar14.elems[0];
  ppVar10 = boost::container::
            vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
            ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                  *)local_150,sVar9);
  boost::container::
  vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
  ::priv_push_back<unsigned_long_const&>(local_1d8,&ppVar10->first);
  ppVar10 = boost::container::
            vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
            ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                  *)local_150,n);
  local_1a8 = (vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
               *)this_00;
  boost::container::
  vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
  ::priv_push_back<unsigned_long_const&>
            ((vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
              *)this_00,&ppVar10->first);
  ppVar10 = boost::container::
            vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
            ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                  *)local_150,sVar9);
  prVar5 = local_1f0;
  node = &local_1f0->box;
  dVar3 = (ppVar10->second).center.values_.elems[1];
  (prVar11->box).center.values_.elems[0] = (ppVar10->second).center.values_.elems[0];
  (prVar11->box).center.values_.elems[1] = dVar3;
  local_1f0 = (reference)&(local_1f0->box).radius;
  dVar3 = (ppVar10->second).radius.values_.elems[1];
  (prVar11->box).radius.values_.elems[0] = (ppVar10->second).radius.values_.elems[0];
  (prVar11->box).radius.values_.elems[1] = dVar3;
  ppVar10 = boost::container::
            vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
            ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                  *)local_150,n);
  ptnr = &pnVar4->box;
  dVar3 = (ppVar10->second).center.values_.elems[1];
  (pnVar4->box).center.values_.elems[0] = (ppVar10->second).center.values_.elems[0];
  (pnVar4->box).center.values_.elems[1] = dVar3;
  local_198 = &(pnVar4->box).radius;
  dVar3 = (ppVar10->second).radius.values_.elems[1];
  (pnVar4->box).radius.values_.elems[0] = (ppVar10->second).radius.values_.elems[0];
  (pnVar4->box).radius.values_.elems[1] = dVar3;
  uVar12 = n;
  if (n < sVar9) {
    uVar12 = sVar9;
  }
  local_1f8.m_ptr = local_150;
  boost::container::operator+((container *)&local_1d0,&local_1f8,uVar12);
  local_178[2].m_ptr =
       (pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)local_1d0.first;
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_190,(const_iterator *)local_150);
  if (n < sVar9) {
    sVar9 = n;
  }
  local_1f8.m_ptr = local_150;
  boost::container::operator+((container *)&local_1d0,&local_1f8,sVar9);
  local_178[1].m_ptr =
       (pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_> *)local_1d0.first;
  boost::container::
  vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
  ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
           *)local_190,(const_iterator *)local_150);
  rhs = &local_1e8->boundary_;
  while( true ) {
    this_01 = local_1a8;
    if (local_38 == 0) {
      return local_1e0;
    }
    uVar12 = (local_1a0->entry).
             super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             .m_holder.m_size;
    if (local_38 <= -(uVar12 - 2) && uVar12 < 2) break;
    uVar12 = (local_1e0->entry).
             super_vector<unsigned_long,_boost::container::dtl::static_storage_allocator<unsigned_long,_6UL,_0UL,_true>,_void>
             .m_holder.m_size;
    if (local_38 <= -(uVar12 - 2) && uVar12 < 2) {
      local_1f8.m_ptr = local_150;
      ppVar13 = local_150 + local_38;
      while (local_1f8.m_ptr != ppVar13) {
        boost::container::
        vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
        ::priv_push_back<unsigned_long_const&>(this_01,&(local_1f8.m_ptr)->first);
        expand<perior::point<double,2ul>>
                  ((type *)&local_1d0,(perior *)ptnr,&(local_1f8.m_ptr)->second,
                   (rectangle<perior::point<double,_2UL>_> *)rhs,b);
        (ptnr->center).values_.elems[0] = (double)local_1d0.first;
        (pnVar4->box).center.values_.elems[1] = local_1d0.second.center.values_.elems[0];
        (local_198->values_).elems[0] = local_1d0.second.center.values_.elems[1];
        (local_198->values_).elems[1] = local_1d0.second.radius.values_.elems[0];
        boost::container::
        vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
        ::operator++((vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                      *)&local_1f8);
      }
      return local_1e0;
    }
    local_190._16_8_ = local_150 + local_38;
    b = (cubic_periodic_boundary<perior::point<double,_2UL>_> *)ptnr;
    local_178[0].m_ptr = local_150;
    pVar15 = rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
             ::
             pick_next<boost::container::vec_iterator<std::pair<unsigned_long,perior::rectangle<perior::point<double,2ul>>>*,false>>
                       ((rtree<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>,perior::quadratic<6ul,2ul>,perior::cubic_periodic_boundary<perior::point<double,2ul>>,perior::indexable_getter<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::equal_to<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>,std::allocator<std::pair<perior::rectangle<perior::point<double,2ul>>,unsigned_long>>>
                         *)local_1e8,local_178,
                        (vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_false>
                         *)(local_190 + 0x10),node,ptnr);
    sVar9 = pVar15.first;
    ppVar10 = boost::container::
              vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
              ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                    *)local_150,sVar9);
    if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      boost::container::
      vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
      ::priv_push_back<unsigned_long_const&>(local_1a8,&ppVar10->first);
      ppVar10 = boost::container::
                vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                      *)local_150,sVar9);
      expand<perior::point<double,2ul>>
                ((type *)&local_1d0,(perior *)ptnr,&ppVar10->second,
                 (rectangle<perior::point<double,_2UL>_> *)rhs,b);
      (ptnr->center).values_.elems[0] = (double)local_1d0.first;
      (pnVar4->box).center.values_.elems[1] = local_1d0.second.center.values_.elems[0];
      prVar11 = (reference)local_198;
    }
    else {
      boost::container::
      vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
      ::priv_push_back<unsigned_long_const&>(local_1d8,&ppVar10->first);
      ppVar10 = boost::container::
                vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                ::at((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
                      *)local_150,sVar9);
      expand<perior::point<double,2ul>>
                ((type *)&local_1d0,(perior *)node,&ppVar10->second,
                 (rectangle<perior::point<double,_2UL>_> *)rhs,b);
      (node->center).values_.elems[0] = (double)local_1d0.first;
      (prVar5->box).center.values_.elems[1] = local_1d0.second.center.values_.elems[0];
      prVar11 = local_1f0;
    }
    *(undefined4 *)(((point_type *)prVar11)->values_).elems =
         local_1d0.second.center.values_.elems[1]._0_4_;
    *(undefined4 *)((long)(((point_type *)prVar11)->values_).elems + 4) =
         local_1d0.second.center.values_.elems[1]._4_4_;
    *(undefined4 *)((((point_type *)prVar11)->values_).elems + 1) =
         local_1d0.second.radius.values_.elems[0]._0_4_;
    *(undefined4 *)((long)(((point_type *)prVar11)->values_).elems + 0xc) =
         local_1d0.second.radius.values_.elems[0]._4_4_;
    local_1f8.m_ptr = local_150;
    boost::container::operator+((container *)&local_1d0,&local_1f8,sVar9);
    local_190._8_8_ = local_1d0.first;
    boost::container::
    vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
    ::erase((vector<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_boost::container::dtl::static_storage_allocator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>,_7UL,_0UL,_true>,_void>
             *)local_190,(const_iterator *)local_150);
  }
  ppVar13 = local_150 + local_38;
  local_1f8.m_ptr = local_150;
  while (local_1f8.m_ptr != ppVar13) {
    boost::container::
    vector<unsigned_long,boost::container::dtl::static_storage_allocator<unsigned_long,6ul,0ul,true>,void>
    ::priv_push_back<unsigned_long_const&>(local_1d8,&(local_1f8.m_ptr)->first);
    expand<perior::point<double,2ul>>
              ((type *)&local_1d0,(perior *)node,&(local_1f8.m_ptr)->second,
               (rectangle<perior::point<double,_2UL>_> *)rhs,b);
    (node->center).values_.elems[0] = (double)local_1d0.first;
    (prVar5->box).center.values_.elems[1] = local_1d0.second.center.values_.elems[0];
    ((container_type *)&local_1f0->is_leaf)->elems[0] = local_1d0.second.center.values_.elems[1];
    ((container_type *)&local_1f0->is_leaf)->elems[1] = local_1d0.second.radius.values_.elems[0];
    boost::container::
    vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
    ::operator++((vec_iterator<std::pair<unsigned_long,_perior::rectangle<perior::point<double,_2UL>_>_>_*,_true>
                  *)&local_1f8);
  }
  return local_1e0;
}

Assistant:

node_type split_leaf(const std::size_t N,
                         const std::size_t vidx, const indexable_type& entry)
    {
        node_type& node = tree_.at(N);
        node_type  partner(true, node.parent);

        typedef typename gen_static_vector<std::pair<std::size_t, indexable_type>,
                max_entry+1>::type temporal_entry_container;
        temporal_entry_container entries;
        entries.push_back(std::make_pair(vidx, entry));

        for(typename node_type::const_iterator
                i(node.entry.begin()), e(node.entry.end()); i != e; ++i)
        {
            entries.push_back(std::make_pair(
                        *i, indexable_getter_(container_.at(*i))));
        }
        node.entry.clear();
        partner.entry.clear(); // for make it sure

        /* assign first 2 entries to node and partner */
        {
            const boost::array<std::size_t, 2> seeds =
                this->pick_seeds(entries.begin(), entries.end());
               node.entry.push_back(entries.at(seeds[0]).first);
            partner.entry.push_back(entries.at(seeds[1]).first);

               node.box = make_aabb(entries.at(seeds[0]).second);
            partner.box = make_aabb(entries.at(seeds[1]).second);

            // remove them from entries pool
            entries.erase(entries.begin() + std::max(seeds[0], seeds[1]));
            entries.erase(entries.begin() + std::min(seeds[0], seeds[1]));
        }

        while(!entries.empty())
        {
            if(min_entry > node.entry.size() &&
               min_entry - node.entry.size() >= entries.size())
            {
                for(typename temporal_entry_container::const_iterator
                        i(entries.begin()), e(entries.end()); i != e; ++i)
                {
                    node.entry.push_back(i->first);
                    node.box = expand(node.box, i->second, this->boundary_);
                }
                return partner;
            }
            if(min_entry > partner.entry.size() &&
               min_entry - partner.entry.size() >= entries.size())
            {
                for(typename temporal_entry_container::const_iterator
                        i(entries.begin()), e(entries.end()); i != e; ++i)
                {
                    partner.entry.push_back(i->first);
                    partner.box = expand(partner.box, i->second, this->boundary_);
                }
                return partner;
            }

            const std::pair<std::size_t, bool> next =
                this->pick_next(entries.begin(), entries.end(), node.box, partner.box);
            if(next.second) // next is for node
            {
                node.entry.push_back(entries.at(next.first).first);
                node.box =
                    expand(node.box, entries.at(next.first).second, this->boundary_);
            }
            else // next is for partner
            {
                partner.entry.push_back(entries.at(next.first).first);
                partner.box =
                    expand(partner.box, entries.at(next.first).second, this->boundary_);
            }
            entries.erase(entries.begin() + next.first);
        }
        return partner;
    }